

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Matrix<double,1,4,1,1,4>,Eigen::Matrix<double,1,4,1,1,4>,Eigen::internal::assign_op<double,double>>
               (Matrix<double,_1,_4,_1,_1,_4> *dst,Matrix<double,_1,_4,_1,_1,_4> *src,
               assign_op<double,_double> *func)

{
  undefined8 func_00;
  Matrix<double,_1,_4,_1,_1,_4> *dstExpr;
  undefined1 local_70 [8];
  Kernel kernel;
  DstEvaluatorType dstEvaluator;
  undefined1 local_30 [8];
  SrcEvaluatorType srcEvaluator;
  assign_op<double,_double> *func_local;
  Matrix<double,_1,_4,_1,_1,_4> *src_local;
  Matrix<double,_1,_4,_1,_1,_4> *dst_local;
  
  srcEvaluator.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>._8_8_
       = func;
  evaluator<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::evaluator
            ((evaluator<Eigen::Matrix<double,_1,_4,_1,_1,_4>_> *)local_30,src);
  resize_if_allowed<Eigen::Matrix<double,1,4,1,1,4>,Eigen::Matrix<double,1,4,1,1,4>,double,double>
            (dst,src,(assign_op<double,_double> *)
                     srcEvaluator.
                     super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>
                     ._8_8_);
  evaluator<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::evaluator
            ((evaluator<Eigen::Matrix<double,_1,_4,_1,_1,_4>_> *)&kernel.m_dstExpr,dst);
  func_00 = srcEvaluator.
            super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>_>._8_8_;
  dstExpr = EigenBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::const_cast_derived
                      ((EigenBase<Eigen::Matrix<double,_1,_4,_1,_1,_4>_> *)dst);
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_Eigen::internal::assign_op<double,_double>,_0>
  ::generic_dense_assignment_kernel
            ((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_Eigen::internal::assign_op<double,_double>,_0>
              *)local_70,(DstEvaluatorType *)&kernel.m_dstExpr,(SrcEvaluatorType *)local_30,
             (assign_op<double,_double> *)func_00,dstExpr);
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_Eigen::internal::assign_op<double,_double>,_0>,_2,_2>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>,_Eigen::internal::assign_op<double,_double>,_0>
         *)local_70);
  evaluator<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::~evaluator
            ((evaluator<Eigen::Matrix<double,_1,_4,_1,_1,_4>_> *)&kernel.m_dstExpr);
  evaluator<Eigen::Matrix<double,_1,_4,_1,_1,_4>_>::~evaluator
            ((evaluator<Eigen::Matrix<double,_1,_4,_1,_1,_4>_> *)local_30);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);
    
  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}